

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::ReadPool(WalletBatch *this,int64_t nPool,CKeyPool *keypool)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  CKeyPool *in_stack_ffffffffffffffd0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *in_stack_ffffffffffffffd8;
  DatabaseBatch *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
            ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
             in_stack_ffffffffffffff88);
  std::make_pair<std::__cxx11::string_const&,long&>
            (in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88);
  bVar2 = DatabaseBatch::Read<std::pair<std::__cxx11::string,long>,wallet::CKeyPool>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
  ~pair(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::ReadPool(int64_t nPool, CKeyPool& keypool)
{
    return m_batch->Read(std::make_pair(DBKeys::POOL, nPool), keypool);
}